

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O3

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorPlatform
          (cmGlobalGhsMultiGenerator *this,string *p,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  cmValue cVar3;
  string *psVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view value;
  string_view value_00;
  string_view value_01;
  string arch;
  string tgt;
  string local_d0;
  size_type local_b0;
  pointer local_a8;
  undefined8 local_a0;
  char *local_98;
  long *local_90;
  pointer local_88;
  long local_80 [2];
  string local_70;
  undefined8 local_50;
  undefined1 *local_48;
  undefined1 local_40 [32];
  
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"GHS_PRIMARY_TARGET","");
  cVar3 = cmMakefile::GetDefinition(mf,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((cVar3.Value != (string *)0x0) &&
     (value_00._M_str = ((cVar3.Value)->_M_dataplus)._M_p,
     value_00._M_len = (cVar3.Value)->_M_string_length, bVar2 = cmValue::IsOff(value_00), !bVar2)) {
    return true;
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"arm","");
  value_01._M_str = (p->_M_dataplus)._M_p;
  value_01._M_len = p->_M_string_length;
  bVar2 = cmValue::IsOff(value_01);
  if (!bVar2) {
    std::__cxx11::string::_M_assign((string *)&local_90);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"GHS_TARGET_PLATFORM","");
  psVar4 = (string *)cmMakefile::GetDefinition(mf,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0.field_2._8_8_ = local_40;
  local_50 = 1;
  local_40[0] = 0x5f;
  local_d0._M_dataplus._M_p = local_88;
  local_d0._M_string_length = (size_type)local_90;
  local_d0.field_2._M_allocated_capacity = 1;
  if (psVar4 == (string *)0x0) {
    psVar4 = &cmValue::Empty_abi_cxx11_;
  }
  local_a8 = (psVar4->_M_dataplus)._M_p;
  local_b0 = psVar4->_M_string_length;
  local_a0 = 4;
  local_98 = ".tgt";
  views._M_len = 4;
  views._M_array = (iterator)&local_d0;
  local_48 = (undefined1 *)local_d0.field_2._8_8_;
  cmCatViews_abi_cxx11_(&local_70,views);
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"GHS_PRIMARY_TARGET","");
  value._M_str = local_70._M_dataplus._M_p;
  value._M_len = local_70._M_string_length;
  cmMakefile::AddDefinition(mf,&local_d0,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return true;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorPlatform(std::string const& p,
                                                     cmMakefile* mf)
{
  /* set primary target */
  cmValue t = mf->GetDefinition("GHS_PRIMARY_TARGET");
  if (cmIsOff(t)) {
    /* Use the value from `-A` or use `arm` */
    std::string arch = "arm";
    if (!cmIsOff(p)) {
      arch = p;
    }
    cmValue platform = mf->GetDefinition("GHS_TARGET_PLATFORM");
    std::string tgt = cmStrCat(arch, '_', platform, ".tgt");

    /* update the primary target name*/
    mf->AddDefinition("GHS_PRIMARY_TARGET", tgt);
  }
  return true;
}